

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipc.c
# Opt level: O0

pint p_ipc_unix_create_key_file(pchar *file_name)

{
  int fd_00;
  int *piVar1;
  pint fd;
  pchar *file_name_local;
  
  if (file_name == (pchar *)0x0) {
    file_name_local._4_4_ = -1;
  }
  else {
    fd_00 = open(file_name,0xc0,0x1a0);
    if (fd_00 == -1) {
      piVar1 = __errno_location();
      file_name_local._4_4_ = -1;
      if (*piVar1 == 0x11) {
        file_name_local._4_4_ = 1;
      }
    }
    else {
      file_name_local._4_4_ = p_sys_close(fd_00);
    }
  }
  return file_name_local._4_4_;
}

Assistant:

pint
p_ipc_unix_create_key_file (const pchar *file_name)
{
	pint fd;

	if (P_UNLIKELY (file_name == NULL))
		return -1;

	if ((fd = open (file_name, O_CREAT | O_EXCL | O_RDONLY, 0640)) == -1)
		/* file already exists */
		return (errno == EEXIST) ? 1 : -1;
	else
		return p_sys_close (fd);
}